

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O2

NamedMDNode * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::NamedMDNode,LLVMBC::Module*&,std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>&,std::vector<LLVMBC::MDNode*,dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode*>>>
          (LLVMContext *this,Module **u,
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *u_1,
          vector<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> *u_2)

{
  Module *module;
  NamedMDNode *this_00;
  _Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_> local_68;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_50;
  
  this_00 = (NamedMDNode *)allocate(this,0x48,8);
  if (this_00 != (NamedMDNode *)0x0) {
    module = *u;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::basic_string(&local_50,u_1);
    local_68._M_impl.super__Vector_impl_data._M_start =
         (u_2->
         super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>).
         _M_impl.super__Vector_impl_data._M_start;
    local_68._M_impl.super__Vector_impl_data._M_finish =
         (u_2->
         super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
         (u_2->
         super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>).
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (u_2->super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (u_2->super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (u_2->super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    NamedMDNode::NamedMDNode(this_00,module,&local_50,(Vector<MDNode_*> *)&local_68);
    std::_Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>::
    ~_Vector_base(&local_68);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::_M_dispose(&local_50);
    append_typed_destructor<LLVMBC::NamedMDNode>(this,this_00);
    return this_00;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}